

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableCommonTest_HashMunging_Test::TestBody(HashtableCommonTest_HashMunging_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  int *v_2;
  sh_hashtable_settings<const_int_*,_Hasher,_unsigned_long,_1> settings_2;
  AssertionResult gtest_ar_1;
  int *v_1;
  sh_hashtable_settings<int_*,_Hasher,_unsigned_long,_1> settings_1;
  AssertionResult gtest_ar;
  int v;
  sh_hashtable_settings<int,_Hasher,_unsigned_long,_1> settings;
  Hasher hasher;
  int **in_stack_fffffffffffffe28;
  sh_hashtable_settings<int_*,_Hasher,_unsigned_long,_1> *in_stack_fffffffffffffe30;
  sh_hashtable_settings<const_int_*,_Hasher,_unsigned_long,_1> *this_01;
  hasher *in_stack_fffffffffffffe38;
  hasher *hf;
  sh_hashtable_settings<const_int_*,_Hasher,_unsigned_long,_1> *in_stack_fffffffffffffe40;
  AssertionResult *this_02;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  int line;
  char *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  Type TVar2;
  Hasher *this_03;
  AssertHelper *in_stack_fffffffffffffe60;
  AssertHelper *this_04;
  Message *in_stack_fffffffffffffea8;
  AssertHelper *in_stack_fffffffffffffeb0;
  AssertionResult local_140;
  undefined8 local_130;
  hasher local_128 [5];
  size_type local_e8;
  size_t local_e0;
  AssertionResult local_d8;
  undefined8 local_c8;
  AssertHelper local_c0 [10];
  size_type local_70;
  size_t local_68;
  AssertionResult local_60;
  undefined4 local_4c;
  
  TVar2 = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  Hasher::Hasher((Hasher *)&stack0xffffffffffffffec,0);
  google::sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_1>::
  sh_hashtable_settings
            ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_1> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38,(float)((ulong)in_stack_fffffffffffffe30 >> 0x20),
             SUB84(in_stack_fffffffffffffe30,0));
  local_4c = 1000;
  local_68 = Hasher::operator()((Hasher *)&stack0xffffffffffffffec,1000);
  local_70 = google::sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_1>::
             hash<int>((sh_hashtable_settings<int,_Hasher,_unsigned_long,_1> *)
                       in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (char *)in_stack_fffffffffffffe40,(unsigned_long *)in_stack_fffffffffffffe38,
             (unsigned_long *)in_stack_fffffffffffffe30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::AssertionResult::failure_message((AssertionResult *)0x9dded0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,TVar2,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
               (char *)in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x9ddf2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9ddf85);
  this_04 = local_c0;
  this_03 = (Hasher *)&stack0xffffffffffffffec;
  google::sparsehash_internal::sh_hashtable_settings<int_*,_Hasher,_unsigned_long,_1>::
  sh_hashtable_settings
            ((sh_hashtable_settings<int_*,_Hasher,_unsigned_long,_1> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38,(float)((ulong)in_stack_fffffffffffffe30 >> 0x20),
             SUB84(in_stack_fffffffffffffe30,0));
  local_c8 = 0x40000;
  local_e0 = Hasher::operator()(this_03,(int *)0x40000);
  TVar2 = (Type)((ulong)this_03 >> 0x20);
  local_e8 = google::sparsehash_internal::sh_hashtable_settings<int*,Hasher,unsigned_long,1>::
             hash<int*>(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (char *)in_stack_fffffffffffffe40,(unsigned_long *)in_stack_fffffffffffffe38,
             (unsigned_long *)in_stack_fffffffffffffe30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    in_stack_fffffffffffffe50 =
         testing::AssertionResult::failure_message((AssertionResult *)0x9de096);
    testing::internal::AssertHelper::AssertHelper
              (this_04,TVar2,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
               (char *)in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x9de0f3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9de14b);
  hf = local_128;
  this_01 = (sh_hashtable_settings<const_int_*,_Hasher,_unsigned_long,_1> *)&stack0xffffffffffffffec
  ;
  google::sparsehash_internal::sh_hashtable_settings<const_int_*,_Hasher,_unsigned_long,_1>::
  sh_hashtable_settings
            (in_stack_fffffffffffffe40,hf,(float)((ulong)this_01 >> 0x20),SUB84(this_01,0));
  local_130 = 0x40000;
  Hasher::operator()(&this_01->super_Hasher,(int *)0x40000);
  this_00 = (AssertHelper *)
            google::sparsehash_internal::sh_hashtable_settings<int_const*,Hasher,unsigned_long,1>::
            hash<int_const*>(this_01,in_stack_fffffffffffffe28);
  this_02 = &local_140;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             &this_02->success_,(unsigned_long *)hf,(unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe4c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0x9de25c);
    testing::internal::AssertHelper::AssertHelper
              (this_04,TVar2,in_stack_fffffffffffffe50,line,&this_02->success_);
    testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x9de2ae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9de300);
  return;
}

Assistant:

TEST(HashtableCommonTest, HashMunging) {
  const Hasher hasher;

  // We don't munge the hash value on non-pointer template types.
  {
    const sparsehash_internal::sh_hashtable_settings<int, Hasher, size_t, 1>
        settings(hasher, 0.0, 0.0);
    const int v = 1000;
    EXPECT_EQ(hasher(v), settings.hash(v));
  }

  {
    // We do munge the hash value on pointer template types.
    const sparsehash_internal::sh_hashtable_settings<int*, Hasher, size_t, 1>
        settings(hasher, 0.0, 0.0);
    int* v = NULL;
    v += 0x10000;  // get a non-trivial pointer value
    EXPECT_NE(hasher(v), settings.hash(v));
  }
  {
    const sparsehash_internal::sh_hashtable_settings<const int*, Hasher, size_t,
                                                     1> settings(hasher, 0.0,
                                                                 0.0);
    const int* v = NULL;
    v += 0x10000;  // get a non-trivial pointer value
    EXPECT_NE(hasher(v), settings.hash(v));
  }
}